

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O0

Type_Info *
chaiscript::detail::Get_Type_Info<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>::get
          (void)

{
  Type_Info *in_RDI;
  
  Type_Info::Type_Info
            (in_RDI,false,false,false,false,false,
             (type_info *)&std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::typeinfo,
             (type_info *)&dispatch::Proxy_Function_Base::typeinfo);
  return in_RDI;
}

Assistant:

constexpr static Type_Info get() noexcept {
        return Type_Info(std::is_const<T>::value,
                         std::is_reference<T>::value,
                         std::is_pointer<T>::value,
                         std::is_void<T>::value,
                         std::is_arithmetic<T>::value
                             && !std::is_same<typename std::remove_const<typename std::remove_reference<T>::type>::type, bool>::value,
                         &typeid(std::shared_ptr<T>),
                         &typeid(typename Bare_Type<T>::type));
      }